

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::pressure_solve(Fluid *this)

{
  int local_18;
  int i;
  int iters;
  Fluid *this_local;
  
  gfx::Program::use(&this->jacobi_iterate_program);
  set_common_uniforms(this,&this->jacobi_iterate_program);
  gfx::Program::validate(&this->jacobi_iterate_program);
  gfx::Program::use(&this->pressure_to_guess_program);
  set_common_uniforms(this,&this->pressure_to_guess_program);
  gfx::Program::validate(&this->pressure_to_guess_program);
  for (local_18 = 0; local_18 < 0x28; local_18 = local_18 + 1) {
    ssbo_barrier(this);
    gfx::Program::use(&this->jacobi_iterate_program);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
    ssbo_barrier(this);
    gfx::Program::use(&this->pressure_to_guess_program);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
  }
  return;
}

Assistant:

void pressure_solve() {
        const int iters = 40;

        jacobi_iterate_program.use();
        set_common_uniforms(jacobi_iterate_program);
        jacobi_iterate_program.validate();

        pressure_to_guess_program.use();
        set_common_uniforms(pressure_to_guess_program);
        pressure_to_guess_program.validate();

        for (int i = 0; i < iters; ++i) {
            ssbo_barrier();
            jacobi_iterate_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);

            ssbo_barrier();
            pressure_to_guess_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        }
    }